

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license++.cpp
# Opt level: O2

EVENT_TYPE acquire_license(char *product,LicenseLocation licenseLocation,LicenseInfo *license)

{
  bool bVar1;
  AuditEvent *pAVar2;
  EVENT_TYPE EVar3;
  string *this;
  pointer this_00;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *this_01;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses_ok;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  EventRegistry er;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses_with_errors;
  LicenseReader lr;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_78;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_60;
  EventRegistry validation_er;
  
  ::license::LicenseReader::LicenseReader(&lr,&licenseLocation);
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&licenses_with_errors,product,(allocator *)&licenses_ok);
  ::license::LicenseReader::readLicenses(&er,&lr,(string *)&licenses_with_errors,&licenses);
  std::__cxx11::string::~string((string *)&licenses_with_errors);
  if (licenses.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      licenses.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pAVar2 = ::license::EventRegistry::getLastFailure(&er);
    EVar3 = pAVar2->event_type;
  }
  else {
    licenses_with_errors.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    licenses_ok.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    licenses_with_errors.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    licenses_with_errors.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    licenses_ok.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    licenses_ok.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (this_00 = licenses.
                   super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        licenses.
        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      ::license::FullLicenseInfo::validate(&validation_er,this_00,0);
      bVar1 = ::license::EventRegistry::isGood(&validation_er);
      this = (string *)&licenses_ok;
      if (!bVar1) {
        this = (string *)&licenses_with_errors;
      }
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::push_back
                ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)this
                 ,this_00);
      ::license::EventRegistry::append(&er,&validation_er);
      std::_Vector_base<AuditEvent,_std::allocator<AuditEvent>_>::~_Vector_base
                ((_Vector_base<AuditEvent,_std::allocator<AuditEvent>_> *)&validation_er);
    }
    if (licenses_ok.
        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        licenses_ok.
        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pAVar2 = ::license::EventRegistry::getLastFailure(&er);
      EVar3 = pAVar2->event_type;
      this_01 = &local_78;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (this_01,&licenses_with_errors);
      mergeLicenses(this_01,license);
    }
    else {
      ::license::EventRegistry::turnErrosIntoWarnings(&er);
      this_01 = &local_60;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (this_01,&licenses_ok);
      EVar3 = LICENSE_OK;
      mergeLicenses(this_01,license);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (this_01);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenses_ok);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenses_with_errors);
  }
  if (license != (LicenseInfo *)0x0) {
    ::license::EventRegistry::exportLastEvents(&er,license->status,5);
  }
  std::_Vector_base<AuditEvent,_std::allocator<AuditEvent>_>::~_Vector_base
            ((_Vector_base<AuditEvent,_std::allocator<AuditEvent>_> *)&er);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenses);
  ::license::LicenseReader::~LicenseReader(&lr);
  return EVar3;
}

Assistant:

EVENT_TYPE acquire_license(const char * product,
		LicenseLocation licenseLocation, LicenseInfo* license) {
	license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	license::EventRegistry er = lr.readLicenses(string(product), licenses);
	EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<license::FullLicenseInfo> licenses_with_errors;
		vector<license::FullLicenseInfo> licenses_ok;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			license::EventRegistry validation_er = it->validate(0);
			if (validation_er.isGood()) {
				licenses_ok.push_back(*it);
			} else {
				licenses_with_errors.push_back(*it);
			}
			er.append(validation_er);
		}
		if (licenses_ok.size() > 0) {
			er.turnErrosIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license);
		} else {
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license);
		}

	} else {
		result = er.getLastFailure()->event_type;
	}
	if (license != NULL) {
		er.exportLastEvents(license->status, 5);
	}
	return result;
}